

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::BinaryStrOperator::Operation<duckdb::string_t,duckdb::string_t>
          (BinaryStrOperator *this,string_t input,Vector *result)

{
  byte bVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  idx_t i;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  undefined1 auVar7 [16];
  string_t target;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  pcVar5 = input_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    pcVar5 = input_local.value.pointer.prefix;
  }
  input_local.value._0_8_ = this;
  auVar7 = duckdb::StringVector::EmptyString(input.value._8_8_,((ulong)this & 0xffffffff) * 8);
  target.value.pointer.ptr = (char *)auVar7._8_8_;
  target.value._0_8_ = auVar7._0_8_;
  pcVar4 = target.value.pointer.ptr;
  if (auVar7._0_4_ < 0xd) {
    pcVar4 = target.value.pointer.prefix;
  }
  for (uVar3 = 0; uVar3 != ((ulong)this & 0xffffffff); uVar3 = uVar3 + 1) {
    bVar1 = pcVar5[uVar3];
    lVar6 = 8;
    while (lVar6 != 0) {
      lVar6 = lVar6 + -1;
      *pcVar4 = (bVar1 >> ((uint)lVar6 & 0x1f) & 1) != 0 | 0x30;
      pcVar4 = pcVar4 + 1;
    }
  }
  string_t::Finalize(&target);
  aVar2.pointer.ptr = target.value.pointer.ptr;
  aVar2._0_8_ = target.value._0_8_;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		// Allocate empty space
		auto target = StringVector::EmptyString(result, size * 8);
		auto output = target.GetDataWriteable();

		for (idx_t i = 0; i < size; ++i) {
			auto byte = static_cast<uint8_t>(data[i]);
			for (idx_t i = 8; i >= 1; --i) {
				*output = ((byte >> (i - 1)) & 0x01) + '0';
				output++;
			}
		}

		target.Finalize();
		return target;
	}